

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O1

bool __thiscall
BamTools::Internal::BamStandardIndex::Jump
          (BamStandardIndex *this,BamRegion *region,bool *hasAlignmentsInRegion)

{
  BamReaderPrivate *this_00;
  bool bVar1;
  int64_t offset;
  string local_60;
  string local_40;
  
  *hasAlignmentsInRegion = false;
  this_00 = (this->super_BamIndex).m_reader;
  if ((this_00 != (BamReaderPrivate *)0x0) && (bVar1 = BamReaderPrivate::IsOpen(this_00), bVar1)) {
    GetOffset(this,region,(int64_t *)&local_60,hasAlignmentsInRegion);
    if (*hasAlignmentsInRegion != true) {
      return true;
    }
    bVar1 = BamReaderPrivate::Seek((this->super_BamIndex).m_reader,(int64_t *)&local_60);
    return bVar1;
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"BamStandardIndex::Jump","");
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"could not jump: reader is not open","");
  BamIndex::SetErrorString(&this->super_BamIndex,&local_60,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return false;
}

Assistant:

bool BamStandardIndex::Jump(const BamRegion& region, bool* hasAlignmentsInRegion) {

    // clear out flag
    *hasAlignmentsInRegion = false;

    // skip if invalid reader or not open
    if ( m_reader == 0 || !m_reader->IsOpen() ) {
        SetErrorString("BamStandardIndex::Jump", "could not jump: reader is not open");
        return false;
    }

    // calculate nearest offset to jump to
    int64_t offset;
    try {
        GetOffset(region, offset, hasAlignmentsInRegion);
    } catch ( BamException& e ) {
        m_errorString = e.what();
        return false;
    }

    // if region has alignments, return success/fail of seeking there
    if ( *hasAlignmentsInRegion )
        return m_reader->Seek(offset);

    // otherwise, simply return true (but hasAlignmentsInRegion flag has been set to false)
    // (this is OK, BamReader will check this flag before trying to load data)
    return true;
}